

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

RunResult __thiscall wabt::interp::Thread::DoSimdShuffle(Thread *this,Instr instr)

{
  Simd<unsigned_char,_(unsigned_char)__x10_> SVar1;
  uchar local_71;
  byte local_51;
  undefined1 uStack_50;
  undefined1 uStack_4f;
  undefined1 uStack_4e;
  undefined1 uStack_4d;
  undefined1 uStack_4c;
  undefined1 uStack_4b;
  undefined1 uStack_4a;
  u8 i;
  S result;
  Simd<unsigned_char,_(unsigned_char)__x10_> lhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> rhs;
  Simd<unsigned_char,_(unsigned_char)__x10_> sel;
  Thread *this_local;
  
  join_0x00000010_0x00000000_ =
       Bitcast<wabt::interp::Simd<unsigned_char,(unsigned_char)16>,v128&>(&instr.field_2.imm_v128);
  join_0x00000010_0x00000000_ = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  SVar1 = Pop<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this);
  result.v[8] = SVar1.v[0];
  result.v[9] = SVar1.v[1];
  result.v[10] = SVar1.v[2];
  result.v[0xb] = SVar1.v[3];
  result.v[0xc] = SVar1.v[4];
  result.v[0xd] = SVar1.v[5];
  result.v[0xe] = SVar1.v[6];
  result.v[0xf] = SVar1.v[7];
  lhs.v[0] = SVar1.v[8];
  lhs.v[1] = SVar1.v[9];
  lhs.v[2] = SVar1.v[10];
  lhs.v[3] = SVar1.v[0xb];
  lhs.v[4] = SVar1.v[0xc];
  lhs.v[5] = SVar1.v[0xd];
  lhs.v[6] = SVar1.v[0xe];
  lhs.v[7] = SVar1.v[0xf];
  for (local_51 = 0; local_51 < 0x10; local_51 = local_51 + 1) {
    if (rhs.v[(ulong)local_51 + 8] < 0x10) {
      local_71 = result.v[(ulong)rhs.v[(ulong)local_51 + 8] + 8];
    }
    else {
      local_71 = lhs.v[(long)(int)(rhs.v[(ulong)local_51 + 8] - 0x10) + 8];
    }
    lhs.v[(ulong)local_51 - 0x18] = local_71;
  }
  SVar1.v[8] = result.v[0];
  SVar1.v[9] = result.v[1];
  SVar1.v[10] = result.v[2];
  SVar1.v[0xb] = result.v[3];
  SVar1.v[0xc] = result.v[4];
  SVar1.v[0xd] = result.v[5];
  SVar1.v[0xe] = result.v[6];
  SVar1.v[0xf] = result.v[7];
  SVar1.v[0] = uStack_50;
  SVar1.v[1] = uStack_4f;
  SVar1.v[2] = uStack_4e;
  SVar1.v[3] = uStack_4d;
  SVar1.v[4] = uStack_4c;
  SVar1.v[5] = uStack_4b;
  SVar1.v[6] = uStack_4a;
  SVar1.v[7] = i;
  Push<wabt::interp::Simd<unsigned_char,(unsigned_char)16>>(this,SVar1);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdShuffle(Instr instr) {
  using S = u8x16;
  auto sel = Bitcast<S>(instr.imm_v128);
  auto rhs = Pop<S>();
  auto lhs = Pop<S>();
  S result;
  for (u8 i = 0; i < S::lanes; ++i) {
    result.v[i] =
        sel.v[i] < S::lanes ? lhs.v[sel.v[i]] : rhs.v[sel.v[i] - S::lanes];
  }
  Push(result);
  return RunResult::Ok;
}